

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECI.cpp
# Opt level: O0

ECI ZXing::ToECI(CharacterSet cs)

{
  bool bVar1;
  _Rb_tree_const_iterator<std::pair<const_ZXing::ECI,_ZXing::CharacterSet>_> *this;
  type *ptVar2;
  type in_DIL;
  type *value;
  type *key;
  const_iterator __end1;
  const_iterator __begin1;
  map<ZXing::ECI,_ZXing::CharacterSet,_std::less<ZXing::ECI>,_std::allocator<std::pair<const_ZXing::ECI,_ZXing::CharacterSet>_>_>
  *__range1;
  map<ZXing::ECI,_ZXing::CharacterSet,_std::less<ZXing::ECI>,_std::allocator<std::pair<const_ZXing::ECI,_ZXing::CharacterSet>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_20;
  _Self local_18;
  undefined1 *local_10;
  type local_5;
  ECI local_4;
  
  if (in_DIL == ISO8859_1) {
    local_4 = ISO8859_1;
  }
  else if (in_DIL == Cp437) {
    local_4 = Cp437;
  }
  else {
    local_10 = ECI_TO_CHARSET;
    local_5 = in_DIL;
    local_18._M_node =
         (_Base_ptr)
         std::
         map<ZXing::ECI,_ZXing::CharacterSet,_std::less<ZXing::ECI>,_std::allocator<std::pair<const_ZXing::ECI,_ZXing::CharacterSet>_>_>
         ::begin(in_stack_ffffffffffffffc8);
    local_20._M_node =
         (_Base_ptr)
         std::
         map<ZXing::ECI,_ZXing::CharacterSet,_std::less<ZXing::ECI>,_std::allocator<std::pair<const_ZXing::ECI,_ZXing::CharacterSet>_>_>
         ::end(in_stack_ffffffffffffffc8);
    while (bVar1 = std::operator!=(&local_18,&local_20), bVar1) {
      std::_Rb_tree_const_iterator<std::pair<const_ZXing::ECI,_ZXing::CharacterSet>_>::operator*
                ((_Rb_tree_const_iterator<std::pair<const_ZXing::ECI,_ZXing::CharacterSet>_> *)
                 0x228250);
      this = (_Rb_tree_const_iterator<std::pair<const_ZXing::ECI,_ZXing::CharacterSet>_> *)
             std::get<0ul,ZXing::ECI_const,ZXing::CharacterSet>
                       ((pair<const_ZXing::ECI,_ZXing::CharacterSet> *)0x22825f);
      ptVar2 = std::get<1ul,ZXing::ECI_const,ZXing::CharacterSet>
                         ((pair<const_ZXing::ECI,_ZXing::CharacterSet> *)0x22826e);
      if (*ptVar2 == local_5) {
        return *(ECI *)&this->_M_node;
      }
      std::_Rb_tree_const_iterator<std::pair<const_ZXing::ECI,_ZXing::CharacterSet>_>::operator++
                (this);
    }
    local_4 = Unknown;
  }
  return local_4;
}

Assistant:

ECI ToECI(CharacterSet cs)
{
	// Special case ISO8859_1 to avoid obsolete ECI 1
	if (cs == CharacterSet::ISO8859_1)
		return ECI::ISO8859_1;
	// Special case Cp437 to avoid obsolete ECI 0 for slightly less obsolete ECI 2
	if (cs == CharacterSet::Cp437)
		return ECI::Cp437;

	for (auto& [key, value] : ECI_TO_CHARSET)
		if (value == cs)
			return key;

	return ECI::Unknown;
}